

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Input.cxx
# Opt level: O3

int __thiscall Fl_File_Input::handle(Fl_File_Input *this,int event)

{
  int iVar1;
  int iVar2;
  Fl_Widget *in_RAX;
  Fl_Window *this_00;
  Fl_Cursor c;
  Fl_Widget_Tracker wp;
  Fl_Widget_Tracker local_28;
  
  switch(event) {
  case 1:
    handle::inButtonBar = Fl::e_y < (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_ + 10;
    break;
  case 2:
  case 5:
    break;
  case 3:
  case 0xb:
    iVar1 = Fl_Widget::active_r((Fl_Widget *)this);
    iVar2 = Fl::e_y;
    if (iVar1 == 0) {
      return 1;
    }
    iVar1 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
    this_00 = Fl_Widget::window((Fl_Widget *)this);
    if (iVar2 < iVar1 + 10) {
      c = FL_CURSOR_DEFAULT;
    }
    else {
      c = FL_CURSOR_INSERT;
    }
    Fl_Window::cursor(this_00,c);
    return 1;
  default:
    local_28.wp_ = in_RAX;
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_28,(Fl_Widget *)this);
    iVar2 = Fl_Input::handle(&this->super_Fl_Input,event);
    if ((iVar2 != 0) && (local_28.wp_ != (Fl_Widget *)0x0)) {
      Fl_Widget::damage((Fl_Widget *)this,'\x10');
    }
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_28);
    return (uint)(iVar2 != 0);
  }
  if (handle::inButtonBar != '\0') {
    handle_button(this,event);
    return 1;
  }
  iVar2 = Fl_Input::handle(&this->super_Fl_Input,event);
  return iVar2;
}

Assistant:

int						// O - TRUE if we handled event
Fl_File_Input::handle(int event) 		// I - Event
{
//  printf("handle(event = %d)\n", event);
  static char inButtonBar = 0;

  switch (event) {
    case FL_MOVE :
    case FL_ENTER :
      if (active_r()) {
	if (Fl::event_y() < (y() + DIR_HEIGHT)) 
          window()->cursor(FL_CURSOR_DEFAULT);
	else 
          window()->cursor(FL_CURSOR_INSERT);
      }

      return 1;

    case FL_PUSH :
      inButtonBar = (Fl::event_y() < (y() + DIR_HEIGHT));
    case FL_RELEASE :
    case FL_DRAG :
      if (inButtonBar) 
        return handle_button(event);
      else
        return Fl_Input::handle(event);

    default :
      { Fl_Widget_Tracker wp(this);
	if (Fl_Input::handle(event)) {
	  if (wp.exists())
	    damage(FL_DAMAGE_BAR);
	  return 1;
	}
      }
      return 0;
  }
}